

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grades.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  long *plVar2;
  ulong uVar3;
  bool bVar4;
  string input;
  char *stopped;
  int gradeArray [6];
  char *local_70;
  long local_68;
  char local_60;
  undefined7 uStack_5f;
  char *local_50;
  int local_48 [6];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Welcome to the grading program!",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please type each grade, followed by the return key.",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Grades can be in the range of 0-5. Type \'exit\' to leave.",0x38
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[4] = 0;
  local_48[5] = 0;
  bVar4 = true;
  do {
    local_68 = 0;
    local_60 = '\0';
    local_70 = &local_60;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Grade: ",7);
    std::operator>>((istream *)&std::cin,(string *)&local_70);
    iVar1 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar1 == 0) {
      printGrades(local_48,6);
      bVar4 = false;
    }
    else {
      uVar3 = strtol(local_70,&local_50,10);
      if (local_50 < local_70 + local_68) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Invalid non-numeric string!",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        plVar2 = &std::cout;
      }
      else {
        if (uVar3 < 6) {
          local_48[uVar3] = local_48[uVar3] + 1;
          goto LAB_001014d0;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Invalid grade number. Please enter a number between 0 and ",0x3a);
        plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,5);
        std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      }
      std::ostream::put((char)plVar2);
      std::ostream::flush();
    }
LAB_001014d0:
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    if (!bVar4) {
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
    cout << "Welcome to the grading program!" << endl;
    cout << "Please type each grade, followed by the return key." << endl;
    cout << "Grades can be in the range of 0-5. Type 'exit' to leave." << endl << endl;

    bool continueGrading = true;
    int gradeArray[NUM_GRADE_COLUMNS] = { 0 };

    do
    {
        string input;
        cout << "Grade: ";
        cin >> input;

        if(input == "exit")
        {
            printGrades(gradeArray, NUM_GRADE_COLUMNS);
            continueGrading = false;
            continue;
        }

        char* stopped;
        long grade = strtol(input.c_str(), &stopped, 10);


        //we can use pointer arithmetic in order to figure out if strtol stopped before the end of the string
        //This is documented in the c++ online reference. If it reads in the whole string it should be pointing
        //At the \0 (end) of the string

        if(stopped >= (input.c_str() + input.length()))
        {
            if(grade >= 0 && grade < NUM_GRADE_COLUMNS)
            {
                addGrade(static_cast<int>(grade), gradeArray);
            }
            else
            {
                cout << "Invalid grade number. Please enter a number between 0 and " << (NUM_GRADE_COLUMNS - 1) << endl;
                continue;
            }
        }
        else
        {
            cout << "Invalid non-numeric string!" << endl;
            continue;
        }




    }
    while(continueGrading);
}